

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_201151b::DescriptorImpl::ToStringHelper
          (DescriptorImpl *this,SigningProvider *arg,string *out,StringType type,
          DescriptorCache *cache)

{
  long lVar1;
  pointer puVar2;
  PubkeyProvider *pPVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  pointer puVar7;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string subscript;
  string ret;
  string extra;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_Descriptor)._vptr_Descriptor[0x10])(&extra,this);
  std::operator+(&subscript,&this->m_name,"(");
  std::operator+(&ret,&subscript,&extra);
  uVar6 = (ulong)(extra._M_string_length != 0);
  std::__cxx11::string::~string((string *)&subscript);
  puVar2 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->m_pubkey_args).
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    if (uVar6 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&ret,",");
    }
    subscript._M_dataplus._M_p = (pointer)&subscript.field_2;
    subscript._M_string_length = 0;
    subscript.field_2._M_local_buf[0] = '\0';
    switch(type) {
    case PUBLIC:
      pPVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
      (*pPVar3->_vptr_PubkeyProvider[5])(&local_b8,pPVar3,0);
      break;
    case PRIVATE:
      pPVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
      iVar5 = (*pPVar3->_vptr_PubkeyProvider[6])(pPVar3,arg,&subscript);
      cVar4 = (char)iVar5;
      goto LAB_005b9e2e;
    case NORMALIZED:
      pPVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
      iVar5 = (*pPVar3->_vptr_PubkeyProvider[7])(pPVar3,arg,&subscript,cache);
      cVar4 = (char)iVar5;
LAB_005b9e2e:
      if (cVar4 != '\0') goto switchD_005b9dbf_default;
      std::__cxx11::string::~string((string *)&subscript);
      cVar4 = '\0';
      goto LAB_005b9f16;
    case COMPAT:
      pPVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
      (*pPVar3->_vptr_PubkeyProvider[5])(&local_b8,pPVar3,1);
      break;
    default:
      goto switchD_005b9dbf_default;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&subscript,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
switchD_005b9dbf_default:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&ret,&subscript);
    std::__cxx11::string::~string((string *)&subscript);
    uVar6 = uVar6 + 1;
  }
  subscript._M_dataplus._M_p = (pointer)&subscript.field_2;
  subscript._M_string_length = 0;
  subscript.field_2._M_local_buf[0] = '\0';
  iVar5 = (*(this->super_Descriptor)._vptr_Descriptor[0x12])(this,arg,&subscript,(ulong)type,cache);
  cVar4 = (char)iVar5;
  if (cVar4 != '\0') {
    if ((uVar6 != 0) && (subscript._M_string_length != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&ret,',');
    }
    std::operator+(&local_d8,&ret,&subscript);
    std::operator+(&local_b8,&local_d8,")");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (out,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  std::__cxx11::string::~string((string *)&subscript);
LAB_005b9f16:
  std::__cxx11::string::~string((string *)&ret);
  std::__cxx11::string::~string((string *)&extra);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)cVar4;
}

Assistant:

virtual bool ToStringHelper(const SigningProvider* arg, std::string& out, const StringType type, const DescriptorCache* cache = nullptr) const
    {
        std::string extra = ToStringExtra();
        size_t pos = extra.size() > 0 ? 1 : 0;
        std::string ret = m_name + "(" + extra;
        for (const auto& pubkey : m_pubkey_args) {
            if (pos++) ret += ",";
            std::string tmp;
            switch (type) {
                case StringType::NORMALIZED:
                    if (!pubkey->ToNormalizedString(*arg, tmp, cache)) return false;
                    break;
                case StringType::PRIVATE:
                    if (!pubkey->ToPrivateString(*arg, tmp)) return false;
                    break;
                case StringType::PUBLIC:
                    tmp = pubkey->ToString();
                    break;
                case StringType::COMPAT:
                    tmp = pubkey->ToString(PubkeyProvider::StringType::COMPAT);
                    break;
            }
            ret += tmp;
        }
        std::string subscript;
        if (!ToStringSubScriptHelper(arg, subscript, type, cache)) return false;
        if (pos && subscript.size()) ret += ',';
        out = std::move(ret) + std::move(subscript) + ")";
        return true;
    }